

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool readFromFile<float,short>
               (string *fname,TWaveformT<short> *res,TTrainKeys *trainKeys,
               int32_t *bufferSize_frames)

{
  int iVar1;
  int iVar2;
  int offset;
  TKey keyPressed;
  TWaveformT<short> *local_240;
  ifstream fin;
  byte abStack_218 [488];
  
  if (*(long *)(trainKeys + 8) != *(long *)trainKeys) {
    *(long *)(trainKeys + 8) = *(long *)trainKeys;
  }
  local_240 = res;
  std::ifstream::ifstream(&fin,(string *)fname,_S_bin);
  iVar1 = *(int *)(abStack_218 + *(long *)(_fin + -0x18));
  if (iVar1 == 0) {
    *bufferSize_frames = 1;
    std::istream::read((char *)&fin,(long)bufferSize_frames);
    iVar2 = *bufferSize_frames;
    offset = 0;
    while( true ) {
      keyPressed = 0;
      std::istream::read((char *)&fin,(long)&keyPressed);
      if ((abStack_218[*(long *)(_fin + -0x18)] & 2) != 0) break;
      std::vector<int,_std::allocator<int>_>::push_back(trainKeys,&keyPressed);
      (anonymous_namespace)::readWaveform<float,short>(&fin,local_240,offset,(long)iVar2 << 0xb);
      if ((abStack_218[*(long *)(_fin + -0x18)] & 2) != 0) break;
      offset = offset + iVar2 * 0x200;
    }
    std::ifstream::close();
  }
  std::ifstream::~ifstream(&fin);
  return iVar1 == 0;
}

Assistant:

bool readFromFile(const std::string & fname, TWaveformT<TSample> & res, TTrainKeys & trainKeys, int32_t & bufferSize_frames) {
    trainKeys.clear();

    std::ifstream fin(fname, std::ios::binary);
    if (fin.good() == false) {
        return false;
    }

    bufferSize_frames = 1;
    fin.read((char *)(&bufferSize_frames), sizeof(bufferSize_frames));

    {
        static_assert(std::is_same<TSampleInput, TSampleF>::value, "TSampleInput not supported");
        static_assert(std::is_same<TSample, TSampleF>::value ||
                      std::is_same<TSample, TSampleI16>::value, "TSample not supported");

        int32_t offset = 0;
        std::streamsize size = bufferSize_frames*kSamplesPerFrame*sizeof(TSampleInput);
        while (true) {
            TKey keyPressed = 0;
            fin.read((char *)(&keyPressed), sizeof(keyPressed));
            if (fin.eof()) break;
            trainKeys.push_back(keyPressed);

            if (readWaveform<TSampleInput>(fin, res, offset, size) == false) {
                return false;
            }

            offset += size/sizeof(TSampleInput);
            if (fin.eof()) break;
        }
    }

    fin.close();

    return true;
}